

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::__cxx11::string>
          (MessageLite *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  bool bVar1;
  int iVar2;
  MessageLite *in_RCX;
  StringPiece input_00;
  
  input_00.length_ = (stringpiece_ssize_type)this;
  input_00.ptr_ = (char *)input->_M_string_length;
  bVar1 = internal::MergePartialFromImpl<false>
                    ((internal *)(input->_M_dataplus)._M_p,input_00,in_RCX);
  if (bVar1) {
    iVar2 = (*this->_vptr_MessageLite[8])(this);
    if ((char)iVar2 != '\0') {
      return true;
    }
    LogInitializationErrorMessage(this);
  }
  return false;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}